

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_unstable.cpp
# Opt level: O1

void merge_3way_unstable(uchar **from0,size_t n0,uchar **from1,size_t n1,uchar **from2,size_t n2,
                        uchar **result)

{
  uchar *puVar1;
  uchar *__s2;
  uchar *__s2_00;
  char *pcVar2;
  byte bVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  size_t __n;
  uint uVar7;
  long lVar8;
  long lVar9;
  size_t sVar10;
  uchar **local_58;
  uchar **local_50;
  size_t local_48;
  
  puVar1 = *from0;
  local_58 = from0;
  local_48 = n0;
  while (puVar1 != (uchar *)0x0) {
    __s2 = *from1;
    if (__s2 == (uchar *)0x0) goto LAB_001bfea4;
    iVar5 = strcmp((char *)puVar1,(char *)__s2);
    __s2_00 = *from2;
    if (__s2_00 == (uchar *)0x0) goto LAB_001bfea4;
    iVar6 = strcmp((char *)__s2,(char *)__s2_00);
    local_50 = from2;
    if (-1 < iVar5) {
      if (iVar5 != 0) {
        iVar5 = 0xb;
        if (iVar6 < 1) {
          if (iVar6 == 0) {
            iVar5 = 0xc;
          }
          else {
            iVar6 = strcmp((char *)puVar1,(char *)__s2_00);
            iVar5 = 0xd;
            if (-1 < iVar6) {
              iVar5 = 0xf - (uint)(iVar6 == 0);
            }
          }
        }
        goto LAB_001bf5ca;
      }
      iVar5 = 8;
      if (iVar6 < 0) goto LAB_001bf5ca;
      switch(iVar6 == 0) {
      case false:
        lVar9 = 0;
        do {
          *(undefined8 *)((long)result + lVar9) = *(undefined8 *)((long)from2 + lVar9);
          if (n2 == 1) goto LAB_001bfdcd;
          pcVar2 = *(char **)((long)from2 + lVar9 + 8);
          if (pcVar2 == (char *)0x0) goto LAB_001bfec3;
          if (*local_58 == (uchar *)0x0) goto LAB_001bfea4;
          iVar5 = strcmp(pcVar2,(char *)*local_58);
          bVar3 = iVar5 == 0 | 8;
          if (iVar5 < 0) {
            bVar3 = 10;
          }
          lVar9 = lVar9 + 8;
          n2 = n2 - 1;
        } while (bVar3 == 10);
        result = (uchar **)((long)result + lVar9);
        if (bVar3 != 8) {
          local_50 = (uchar **)((long)from2 + lVar9);
          goto switchD_001bf5bc_caseD_1;
        }
        local_50 = (uchar **)((long)from2 + lVar9);
        *result = *local_58;
        puVar1 = *from1;
        from1 = from1 + 1;
        result[1] = puVar1;
        result = result + 2;
        n1 = n1 - 1;
        local_48 = local_48 - 1;
        if (local_48 == 0) goto LAB_001bfe0b;
        local_58 = local_58 + 1;
        if (n1 != 0) goto LAB_001bfd68;
        break;
      case true:
switchD_001bf5bc_caseD_1:
        *result = *local_58;
        puVar1 = *from1;
        from1 = from1 + 1;
        result[1] = puVar1;
        puVar1 = *local_50;
        local_50 = local_50 + 1;
        result[2] = puVar1;
        result = result + 3;
        n1 = n1 - 1;
        n2 = n2 - 1;
        local_48 = local_48 - 1;
        if (local_48 == 0) goto LAB_001bfe0b;
        local_58 = local_58 + 1;
        if (n1 != 0) goto joined_r0x001bfd23;
      }
LAB_001bfdb5:
      if (local_48 == 0) goto LAB_001bfe37;
      if (n2 == 0) goto LAB_001bfe4b;
      goto LAB_001bfe21;
    }
    iVar5 = 3;
    if (iVar6 < 0) {
LAB_001bf5ca:
      (*(code *)((long)&DAT_001eca5c + (long)(int)(&DAT_001eca5c)[iVar5 - 3]))();
      return;
    }
    if (iVar6 == 0) {
      iVar5 = 4;
      goto LAB_001bf5ca;
    }
    iVar6 = strcmp((char *)puVar1,(char *)__s2_00);
    iVar5 = 5;
    if (iVar6 < 0) goto LAB_001bf5ca;
    switch(iVar6 == 0) {
    case false:
      lVar9 = 0;
      do {
        sVar10 = n2;
        *(undefined8 *)((long)result + lVar9) = *(undefined8 *)((long)from2 + lVar9);
        if (sVar10 == 1) goto LAB_001bfdcd;
        pcVar2 = *(char **)((long)from2 + lVar9 + 8);
        if (pcVar2 == (char *)0x0) goto LAB_001bfec3;
        if (*local_58 == (uchar *)0x0) goto LAB_001bfea4;
        iVar5 = strcmp(pcVar2,(char *)*local_58);
        uVar7 = 7;
        if (-1 < iVar5) {
          if (iVar5 == 0) {
            uVar7 = 0x15;
          }
          else {
            if (*from1 == (uchar *)0x0) goto LAB_001bfea4;
            iVar5 = strcmp(pcVar2,(char *)*from1);
            uVar7 = 3;
            if (iVar5 == 0) {
              uVar7 = 0x16;
            }
            if (iVar5 < 0) {
              uVar7 = 5;
            }
          }
        }
        lVar9 = lVar9 + 8;
        n2 = sVar10 - 1;
      } while (uVar7 == 7);
      if (uVar7 < 0x15) {
        if (uVar7 != 3) {
          lVar8 = 0;
          goto LAB_001bf79e;
        }
        lVar8 = 0;
        goto LAB_001bf5ee;
      }
      if (uVar7 == 0x15) {
        result = (uchar **)((long)result + lVar9);
        local_50 = (uchar **)((long)from2 + lVar9);
        goto switchD_001bf54b_caseD_1;
      }
      local_50 = (uchar **)((long)from2 + lVar9);
      lVar8 = 0;
      do {
        *(undefined8 *)((long)result + lVar8 + lVar9) = *(undefined8 *)((long)local_58 + lVar8);
        if (local_48 == 1) goto LAB_001bfdfa;
        pcVar2 = *(char **)((long)local_58 + lVar8 + 8);
        if (pcVar2 == (char *)0x0) goto LAB_001bfec3;
        if (*from1 == (uchar *)0x0) goto LAB_001bfea4;
        iVar5 = strcmp(pcVar2,(char *)*from1);
        cVar4 = (iVar5 != 0) * '\x03' + '\t';
        if (iVar5 < 0) {
          cVar4 = '\x04';
        }
        lVar8 = lVar8 + 8;
        local_48 = local_48 - 1;
      } while (cVar4 == '\x04');
      result = (uchar **)((long)result + lVar8 + lVar9);
      local_58 = (uchar **)((long)local_58 + lVar8);
      if (cVar4 == '\t') goto switchD_001bf5bc_caseD_1;
      *result = *from1;
      puVar1 = *local_50;
      local_50 = local_50 + 1;
      result[1] = puVar1;
      result = result + 2;
      n2 = sVar10 - 2;
      n1 = n1 - 1;
      if (n1 == 0) goto LAB_001bfdb5;
      from1 = from1 + 1;
      break;
    case true:
switchD_001bf54b_caseD_1:
      *result = *local_58;
      puVar1 = *local_50;
      local_50 = local_50 + 1;
      result[1] = puVar1;
      result = result + 2;
      n2 = n2 - 1;
      local_48 = local_48 - 1;
      if (local_48 == 0) goto LAB_001bfe0b;
      local_58 = local_58 + 1;
    }
joined_r0x001bfd23:
    if (n2 == 0) goto LAB_001bfde3;
LAB_001bfd68:
    from2 = local_50;
    puVar1 = *local_58;
  }
LAB_001bfec3:
  __assert_fail("a != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_unstable.cpp"
                ,0x36,"int cmp(const unsigned char *, const unsigned char *)");
LAB_001bfdcd:
  result = (uchar **)((long)result + lVar9 + 8);
LAB_001bfde3:
  n2 = n1;
  if (local_48 != 0) {
    local_50 = from1;
    if (n2 != 0) {
LAB_001bfe21:
      merge_2way_unstable(local_58,local_48,local_50,n2,result);
      return;
    }
LAB_001bfe4b:
    __n = local_48 << 3;
    from1 = local_58;
    goto LAB_001bfe6e;
  }
  local_48 = n2;
  if (n2 == 0) {
    return;
  }
  goto LAB_001bfe61;
LAB_001bf5ee:
  *(undefined8 *)((long)result + lVar8 + lVar9) = *(undefined8 *)((long)local_58 + lVar8);
  if (local_48 == 1) goto LAB_001bfdfa;
  pcVar2 = *(char **)((long)local_58 + lVar8 + 8);
  if (pcVar2 == (char *)0x0) goto LAB_001bfec3;
  if (*from1 == (uchar *)0x0) goto LAB_001bfea4;
  iVar5 = strcmp(pcVar2,(char *)*from1);
  uVar7 = 3;
  if (-1 < iVar5) {
    if (iVar5 == 0) {
      uVar7 = 8;
    }
    else {
      if (*(char **)((long)from2 + lVar9) == (char *)0x0) goto LAB_001bfea4;
      iVar5 = strcmp(pcVar2,*(char **)((long)from2 + lVar9));
      uVar7 = iVar5 == 0 ^ 0xf;
      if (iVar5 < 0) {
        uVar7 = 0xd;
      }
    }
  }
  lVar8 = lVar8 + 8;
  local_48 = local_48 - 1;
  if (uVar7 != 3) {
    (*(code *)((long)&DAT_001eca90 + (long)(int)(&DAT_001eca90)[uVar7 - 8]))();
    return;
  }
  goto LAB_001bf5ee;
LAB_001bf79e:
  *(undefined8 *)((long)result + lVar8 + lVar9) = *(undefined8 *)((long)local_58 + lVar8);
  if (local_48 == 1) goto LAB_001bfdfa;
  pcVar2 = *(char **)((long)local_58 + lVar8 + 8);
  if (pcVar2 == (char *)0x0) goto LAB_001bfec3;
  if (*(char **)((long)from2 + lVar9) == (char *)0x0) goto LAB_001bfea4;
  iVar5 = strcmp(pcVar2,*(char **)((long)from2 + lVar9));
  uVar7 = 5;
  if (-1 < iVar5) {
    if (iVar5 == 0) {
      uVar7 = 6;
    }
    else {
      if (*from1 == (uchar *)0x0) {
LAB_001bfea4:
        __assert_fail("b != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_unstable.cpp"
                      ,0x37,"int cmp(const unsigned char *, const unsigned char *)");
      }
      iVar5 = strcmp(pcVar2,(char *)*from1);
      uVar7 = iVar5 == 0 ^ 0xb;
      if (iVar5 < 0) {
        uVar7 = 7;
      }
    }
  }
  lVar8 = lVar8 + 8;
  local_48 = local_48 - 1;
  if (uVar7 != 5) {
    (*(code *)((long)&DAT_001ecab0 + (long)(int)(&DAT_001ecab0)[uVar7 - 6]))();
    return;
  }
  goto LAB_001bf79e;
LAB_001bfdfa:
  local_50 = (uchar **)((long)from2 + lVar9);
  result = (uchar **)((long)result + lVar8 + lVar9 + 8);
LAB_001bfe0b:
  local_48 = n1;
  if (local_48 == 0) {
LAB_001bfe37:
    if (n2 == 0) {
      return;
    }
    __n = n2 << 3;
    from1 = local_50;
    goto LAB_001bfe6e;
  }
  local_58 = from1;
  if (n2 != 0) goto LAB_001bfe21;
LAB_001bfe61:
  __n = local_48 << 3;
LAB_001bfe6e:
  memcpy(result,from1,__n);
  return;
}

Assistant:

static void
merge_3way_unstable(unsigned char** restrict from0, size_t n0,
                    unsigned char** restrict from1, size_t n1,
                    unsigned char** restrict from2, size_t n2,
                    unsigned char** restrict result)
{
	debug()<<__func__<<"(), n0="<<n0<<", n1="<<n1<<", n2="<<n2<<"\n";

initial:
{
	const int cmp01 = cmp(*from0, *from1);
	const int cmp12 = cmp(*from1, *from2);
	int cmp02 = 0;
	if (cmp01 < 0) {
		if (cmp12 < 0)  { goto state0lt1lt2; }
		if (cmp12 == 0) { goto state0lt1eq2; }
		cmp02 = cmp(*from0, *from2);
		if (cmp02 < 0)  { goto state0lt2lt1; }
		if (cmp02 == 0) { goto state0eq2lt1; }
		goto state2lt0lt1;
	}
	if (cmp01 == 0) {
		if (cmp12 < 0)  { goto state0eq1lt2; }
		if (cmp12 == 0) { goto all_eq;       }
		goto state2lt0eq1;
	}
	if (cmp12 > 0)  { goto state2lt1lt0; }
	if (cmp12 == 0) { goto state1eq2lt0; }
	cmp02 = cmp(*from0, *from2);
	if (cmp02 < 0)  { goto state1lt0lt2; }
	if (cmp02 == 0) { goto state1lt0eq2; }
	goto state1lt2lt0;
}

#define StrictCase(a,b,c)                                                      \
	state##a##lt##b##lt##c:                                                \
	{                                                                      \
		*result++ = *from##a++;                                        \
		if (--n##a == 0) goto finish##a;                               \
		int cmpab = cmp(*from##a, *from##b);                           \
		if (cmpab < 0)  goto state##a##lt##b##lt##c;                   \
		if (cmpab == 0) goto state##a##eq##b##lt##c;                   \
		int cmpac = cmp(*from##a, *from##c);                           \
		if (cmpac < 0)  goto state##b##lt##a##lt##c;                   \
		if (cmpac == 0) goto state##b##lt##a##eq##c;                   \
		goto state##b##lt##c##lt##a;                                   \
	}
	StrictCase(0, 1, 2)
	StrictCase(0, 2, 1)
	StrictCase(1, 0, 2)
	StrictCase(1, 2, 0)
	StrictCase(2, 0, 1)
	StrictCase(2, 1, 0)
#undef StrictCase

#define EqLt(a,b,c)                                                            \
	static_assert(a < b, "a < b");                                         \
	state##a##eq##b##lt##c:                                                \
	{                                                                      \
		*result++ = *from ##a ++;                                      \
		*result++ = *from ##b ++;                                      \
		--n##a;                                                        \
		--n##b;                                                        \
		if (n##a == 0) goto finish ##a;                                \
		if (n##b == 0) goto finish ##b;                                \
		goto initial;                                                  \
	}
	EqLt(0, 1, 2)
	EqLt(0, 2, 1)
	EqLt(1, 2, 0)
state2eq0lt1: goto state0eq2lt1;
state1eq0lt2: goto state0eq1lt2;
state2eq1lt0: goto state1eq2lt0;
#undef EqLt

#define LtEq(a,b,c)                                                            \
	static_assert(b < c, "b < c");                                         \
	state##a##lt##b##eq##c:                                                \
	{                                                                      \
		*result++ = *from##a++;                                        \
		if (--n##a == 0) goto finish##a;                               \
		int cmpab = cmp(*from##a, *from##b);                           \
		if (cmpab < 0)  goto state##a##lt##b##eq##c;                   \
		if (cmpab == 0) goto all_eq;                                   \
		goto state##b##eq##c##lt## a;                                  \
	}
	LtEq(0, 1, 2)
	LtEq(1, 0, 2)
	LtEq(2, 0, 1)
state0lt2eq1: goto state0lt1eq2;
state1lt2eq0: goto state1lt0eq2;
state2lt1eq0: goto state2lt0eq1;
#undef LtEq

all_eq:
{
	*result++ = *from0++;
	*result++ = *from1++;
	*result++ = *from2++;
	--n0;
	--n1;
	--n2;
	if (n0==0) goto finish0;
	if (n1==0) goto finish1;
	if (n2==0) goto finish2;
	goto initial;
}

finish0:
	assert(n0 == 0);
	if (n1) {
		if (n2) {
			merge_2way_unstable(from1, n1, from2, n2, result);
		} else {
			(void) memcpy(result, from1, n1*sizeof(unsigned char*));
		}
	} else if (n2) {
		(void) memcpy(result, from2, n2*sizeof(unsigned char*));
	}
	debug()<< "~" << __func__ << "\n";
	return;
finish1:
	assert(n1 == 0);
	if (n0) {
		if (n2) {
			merge_2way_unstable(from0, n0, from2, n2, result);
		} else {
			(void) memcpy(result, from0, n0*sizeof(unsigned char*));
		}
	} else if (n2) {
		(void) memcpy(result, from2, n2*sizeof(unsigned char*));
	}
	debug()<< "~" << __func__ << "\n";
	return;
finish2:
	assert(n2 == 0);
	if (n0) {
		if (n1) {
			merge_2way_unstable(from0, n0, from1, n1, result);
		} else {
			(void) memcpy(result, from0, n0*sizeof(unsigned char*));
		}
	} else if (n1) {
		(void) memcpy(result, from1, n1*sizeof(unsigned char*));
	}
	debug()<< "~" << __func__ << "\n";
	return;
}